

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

void Curl_ssl_scache_remove_all(Curl_cfilter *cf,Curl_easy *data,char *ssl_peer_key)

{
  CURLcode CVar1;
  Curl_ssl_scache_peer *pCStack_38;
  CURLcode result;
  Curl_ssl_scache_peer *peer;
  ssl_primary_config *conn_config;
  Curl_ssl_scache *scache;
  char *ssl_peer_key_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  scache = (Curl_ssl_scache *)ssl_peer_key;
  ssl_peer_key_local = (char *)data;
  data_local = (Curl_easy *)cf;
  conn_config = (ssl_primary_config *)cf_ssl_scache_get(data);
  peer = (Curl_ssl_scache_peer *)Curl_ssl_cf_get_primary_config((Curl_cfilter *)data_local);
  pCStack_38 = (Curl_ssl_scache_peer *)0x0;
  if (conn_config != (ssl_primary_config *)0x0) {
    Curl_ssl_scache_lock((Curl_easy *)ssl_peer_key_local);
    CVar1 = cf_ssl_find_peer_by_key
                      ((Curl_easy *)ssl_peer_key_local,(Curl_ssl_scache *)conn_config,(char *)scache
                       ,(ssl_primary_config *)peer,&stack0xffffffffffffffc8);
    if ((CVar1 == CURLE_OK) && (pCStack_38 != (Curl_ssl_scache_peer *)0x0)) {
      cf_ssl_scache_clear_peer(pCStack_38);
    }
    Curl_ssl_scache_unlock((Curl_easy *)ssl_peer_key_local);
  }
  return;
}

Assistant:

void Curl_ssl_scache_remove_all(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                const char *ssl_peer_key)
{
  struct Curl_ssl_scache *scache = cf_ssl_scache_get(data);
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct Curl_ssl_scache_peer *peer = NULL;
  CURLcode result;

  (void)cf;
  if(!scache)
    return;

  Curl_ssl_scache_lock(data);
  result = cf_ssl_find_peer_by_key(data, scache, ssl_peer_key, conn_config,
                                   &peer);
  if(!result && peer)
    cf_ssl_scache_clear_peer(peer);
  Curl_ssl_scache_unlock(data);
}